

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadGroupNode(CoronaLoader *this,Ref<embree::XML> *xml)

{
  Ref<embree::XML> *xml_00;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_> *pAVar1;
  GroupNode *this_00;
  GroupNode *this_01;
  TransformNode *this_02;
  runtime_error *this_03;
  long *in_RDX;
  ulong uVar2;
  long lVar3;
  Ref<embree::SceneGraph::Node> local_90;
  MaterialNode *local_88;
  CoronaLoader *local_80;
  undefined1 local_78 [32];
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  p;
  
  xml_00 = *(Ref<embree::XML> **)(*in_RDX + 0x80);
  local_80 = this;
  if (*(Ref<embree::XML> **)(*in_RDX + 0x88) != xml_00) {
    loadInstances(&p,(CoronaLoader *)xml,xml_00);
    if (p.first.ptr != (MaterialNode *)0x0) {
      (*((p.first.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(p.first.ptr);
    }
    this_00 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_00,0);
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    for (uVar2 = 1; uVar2 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3);
        uVar2 = uVar2 + 1) {
      loadObject((CoronaLoader *)local_78,xml);
      SceneGraph::GroupNode::add(this_00,(Ref<embree::SceneGraph::Node> *)local_78);
      if ((TransformNode *)local_78._0_8_ != (TransformNode *)0x0) {
        (**(code **)(*(long *)local_78._0_8_ + 0x18))();
      }
    }
    local_88 = p.first.ptr;
    if (p.first.ptr != (MaterialNode *)0x0) {
      (*((p.first.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(p.first.ptr);
    }
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[5])(this_00);
    if (local_88 != (MaterialNode *)0x0) {
      (*(local_88->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    this_01 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,0);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < p.second.size_active; uVar2 = uVar2 + 1) {
      this_02 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
      pAVar1 = p.second.items;
      local_90.ptr = (Node *)this_00;
      (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
      SceneGraph::TransformNode::TransformNode
                (this_02,(AffineSpace3fa *)((long)&(pAVar1->l).vx.field_0 + lVar3),&local_90);
      local_78._0_8_ = this_02;
      (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
      SceneGraph::GroupNode::add(this_01,(Ref<embree::SceneGraph::Node> *)local_78);
      if ((TransformNode *)local_78._0_8_ != (TransformNode *)0x0) {
        (**(code **)(*(long *)local_78._0_8_ + 0x18))();
      }
      if ((GroupNode *)local_90.ptr != (GroupNode *)0x0) {
        (*(((Node *)&(local_90.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
      }
      lVar3 = lVar3 + 0x40;
    }
    (local_80->path).filename._M_dataplus._M_p = (pointer)this_01;
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_01);
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
    if (p.first.ptr != (MaterialNode *)0x0) {
      (*((p.first.ptr)->super_Node).super_RefCount._vptr_RefCount[3])(p.first.ptr);
    }
    std::
    pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
    ::~pair(&p);
    return (Ref<embree::SceneGraph::Node>)(Node *)local_80;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_((string *)local_78,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 ": invalid group node");
  std::runtime_error::runtime_error(this_03,(string *)&p);
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadGroupNode(const Ref<XML>& xml) 
  {
    if (xml->children.size() < 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid group node");

    /* load instances */
    auto p = loadInstances(xml->children[0]);
    Ref<SceneGraph::MaterialNode> material = p.first;
    avector<AffineSpace3fa>& xfms = p.second;
    
    /* load meshes */
    Ref<SceneGraph::GroupNode> objects = new SceneGraph::GroupNode;
    for (size_t i=1; i<xml->children.size(); i++)
      objects->add(loadObject(xml->children[i]));
    
    /* force material */
    objects->setMaterial(material);

    /* create instances */
    Ref<SceneGraph::GroupNode> instances = new SceneGraph::GroupNode;
    for (size_t i=0; i<xfms.size(); i++) 
      instances->add(new SceneGraph::TransformNode(xfms[i],objects.cast<SceneGraph::Node>()));

    return instances.cast<SceneGraph::Node>();
  }